

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

char * level_name(level_conflict *lev)

{
  char *pcVar1;
  char *local_18;
  char *name;
  level_conflict *lev_local;
  
  if (lev->depth == 0) {
    pcVar1 = locality_name(lev->locality);
    local_18 = format("%s Town",pcVar1);
  }
  else {
    pcVar1 = locality_name(lev->locality);
    local_18 = format("%s %d",pcVar1,(ulong)(uint)lev->depth);
  }
  return local_18;
}

Assistant:

char *level_name(struct level *lev)
{
	char *name;

	if (lev->depth) {
		name = format("%s %d", locality_name(lev->locality), lev->depth);
	} else {
		name = format("%s Town", locality_name(lev->locality));
	}
	return name;
}